

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawBufferObjectUtil.cpp
# Opt level: O2

SharedPtr<vkt::Draw::Buffer> __thiscall
vkt::Draw::Buffer::create
          (Buffer *this,DeviceInterface *vk,VkDevice device,VkBufferCreateInfo *createInfo)

{
  Buffer *ptr;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<vkt::Draw::Buffer> SVar1;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_48;
  
  ptr = (Buffer *)operator_new(0x40);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_48,vk,device,createInfo,
                     (VkAllocationCallbacks *)0x0);
  (ptr->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)0x0;
  (ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       local_48.m_data.deleter.m_device;
  (ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       local_48.m_data.deleter.m_allocator;
  (ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_48.m_data.object.m_internal;
  (ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       local_48.m_data.deleter.m_deviceIface;
  local_48.m_data.object.m_internal = 0;
  local_48.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_48.m_data.deleter.m_device = (VkDevice)0x0;
  local_48.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ptr->m_vk = vk;
  ptr->m_device = device;
  de::SharedPtr<vkt::Draw::Buffer>::SharedPtr((SharedPtr<vkt::Draw::Buffer> *)this,ptr);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_48);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = this;
  return SVar1;
}

Assistant:

de::SharedPtr<Buffer> Buffer::create (const vk::DeviceInterface& vk,
									  vk::VkDevice device,
									  const vk::VkBufferCreateInfo& createInfo)
{
	return de::SharedPtr<Buffer>(new Buffer(vk, device, vk::createBuffer(vk, device, &createInfo)));
}